

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * sbuf_read(char *pathname)

{
  int iVar1;
  int len;
  int local_14;
  char *local_10;
  
  iVar1 = buf_read(pathname,&local_10,&local_14);
  if (iVar1 < 0) {
    free(local_10);
    local_10 = (char *)0x0;
  }
  return local_10;
}

Assistant:

char *sbuf_read(const char *pathname) {
  char *buf;
  int len;

  if (buf_read(pathname, &buf, &len) < 0) {
    FREE(buf);
    buf = NULL;
    return NULL;
  }
  return buf;
}